

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void do_genocide(int how,boolean only_on_level)

{
  char cVar1;
  monst *mdef;
  short sVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  permonst *pm;
  char *pcVar8;
  monst *pmVar9;
  char *pcVar10;
  bool bVar11;
  char *pcVar12;
  int iVar13;
  char buf [256];
  char local_138 [264];
  
  iVar4 = u.umonster;
  if ((how & 2U) == 0) {
    iVar13 = 5;
    do {
      getlin("What monster do you want to genocide? [type the name]",local_138);
      mungspaces(local_138);
      iVar4 = strncasecmp(local_138,"none",0xffffffffffffffff);
      if ((iVar4 == 0) || (iVar4 = strncasecmp(local_138,"nothing",0xffffffffffffffff), iVar4 == 0))
      {
        if ((how & 1U) != 0) {
          return;
        }
        pm = rndmonst(level);
        if (pm == (permonst *)0x0) {
          return;
        }
        iVar4 = monsndx(pm);
        bVar11 = true;
        goto LAB_0022f137;
      }
      if ((flags.debug != '\0') && (local_138[0] == '*')) {
        uVar6 = 0;
        pmVar9 = level->monlist;
        while (mdef = pmVar9, mdef != (monst *)0x0) {
          pmVar9 = mdef->nmon;
          if (0 < mdef->mhp) {
            mongone(mdef);
            uVar6 = uVar6 + 1;
          }
        }
        pcVar12 = "s";
        if (uVar6 == 1) {
          pcVar12 = "";
        }
        pline("Eliminated %d monster%s.",(ulong)uVar6,pcVar12);
        return;
      }
      iVar4 = name_to_mon(local_138);
      pcVar12 = "do not";
      if (iVar4 == -1) {
LAB_0022f0e1:
        pline("Such creatures %s exist in this world.",pcVar12);
      }
      else {
        pcVar12 = "no longer";
        if ((mvitals[iVar4].mvflags & 2) != 0) goto LAB_0022f0e1;
        pm = mons + iVar4;
        if (iVar4 == urole.malenum) {
          bVar11 = false;
          goto LAB_0022f137;
        }
        bVar11 = false;
        if ((urole.femalenum != -1 && iVar4 == urole.femalenum) || (iVar4 == urace.malenum))
        goto LAB_0022f137;
        if (urace.femalenum != -1 && iVar4 == urace.femalenum) {
          bVar11 = false;
          goto LAB_0022f137;
        }
        uVar6 = mons[iVar4].mflags2;
        if ((uVar6 & 8) != 0) {
          iVar5 = sgn((int)u.ualign.type);
          adjalign(-iVar5);
        }
        if ((uVar6 >> 9 & 1) != 0) {
          iVar5 = sgn((int)u.ualign.type);
          adjalign(iVar5);
        }
        if ((mons[iVar4].geno & 0x20) != 0) {
          bVar11 = pm != youmonst.data ||
                   u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0;
          goto LAB_0022f137;
        }
        if (flags.soundok != '\0') {
          if (flags.verbose != '\0') {
            pline("A thunderous voice booms through the caverns:");
          }
          verbalize("No, mortal!  That will not be done.");
        }
      }
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    pcVar12 = "That\'s enough tries!";
    goto LAB_0022f2b9;
  }
  pm = mons + u.umonster;
  pcVar12 = mons_mname(pm);
  strcpy(local_138,pcVar12);
  bVar11 = false;
LAB_0022f137:
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
    pcVar12 = mons_mname(pm);
    strcpy(local_138,pcVar12);
    if ((pm != mons + 0x120 & *(byte *)((long)&pm->geno + 1) >> 4) != 1) goto LAB_0022f277;
    pcVar12 = "";
    if ((pm->mflags2 & 0x80000) == 0) {
      pcVar12 = "the ";
    }
  }
  else {
    if (u.umonnum == u.umonster) {
      pcVar12 = urole.name.f;
      if (urole.name.f == (char *)0x0) {
        pcVar12 = urole.name.m;
      }
      if (flags.female == '\0') {
        pcVar12 = urole.name.m;
      }
      strcpy(local_138,pcVar12);
      local_138[0] = lowc(local_138[0]);
    }
    else {
      pcVar12 = mons_mname(youmonst.data);
      strcpy(local_138,pcVar12);
    }
LAB_0022f277:
    pcVar12 = "all ";
  }
  if ((how & 1U) != 0) {
    if (only_on_level == '\0') {
      mvitals[iVar4].mvflags = mvitals[iVar4].mvflags | 0x12;
    }
    cVar1 = *pcVar12;
    if (cVar1 == 'a') {
      pcVar8 = makeplural(local_138);
    }
    else {
      pcVar8 = local_138;
    }
    pcVar10 = " from this level";
    if (only_on_level == '\0') {
      pcVar10 = "";
    }
    pline("Wiped out %s%s%s.",pcVar12,pcVar8,pcVar10);
    if (only_on_level == '\0') {
      if (cVar1 == 'a') {
        pcVar8 = makeplural(local_138);
      }
      else {
        pcVar8 = local_138;
      }
      historic_event('\0',"genocided %s%s",pcVar12,pcVar8);
    }
    sVar2 = urole.femalenum;
    if (bVar11) {
      if (pm == youmonst.data) {
        rehumanize();
      }
    }
    else {
      if (only_on_level == '\0') {
        iVar13 = (int)urole.malenum;
        if (((long)urole.femalenum != -1) && (iVar4 == iVar13)) {
          mvitals[urole.femalenum].mvflags = mvitals[urole.femalenum].mvflags | 0x12;
        }
        if (iVar4 == sVar2 && sVar2 != -1) {
          mvitals[iVar13].mvflags = mvitals[iVar13].mvflags | 0x12;
        }
        sVar2 = urace.femalenum;
        iVar13 = (int)urace.malenum;
        if (((long)urace.femalenum != -1) && (iVar4 == iVar13)) {
          mvitals[urace.femalenum].mvflags = mvitals[urace.femalenum].mvflags | 0x12;
        }
        if (iVar4 == sVar2 && sVar2 != -1) {
          mvitals[iVar13].mvflags = mvitals[iVar13].mvflags | 0x12;
        }
      }
      u.uhp = -1;
      if ((how & 2U) == 0) {
        killer_format = 0;
        pcVar12 = "imperious order";
        if ((how & 4U) == 0) {
          pcVar12 = "scroll of genocide";
        }
      }
      else {
        killer_format = 1;
        pcVar12 = "genocidal confusion";
      }
      if ((u.umonnum == u.umonster) || (pm == youmonst.data)) {
        killer = pcVar12;
        done(10);
      }
      else {
        killer = (char *)0x0;
        delayed_killer = pcVar12;
        pline("You feel dead inside.");
      }
    }
    if (only_on_level != '\0') {
      kill_monster_on_level(iVar4);
      return;
    }
    reset_rndmonst(iVar4);
    kill_genocided_monsters();
    update_inventory();
    return;
  }
  if (((mons[iVar4].geno & 0x1000) == 0) && ((mvitals[iVar4].mvflags & 3) == 0)) {
    uVar6 = mt_random();
    iVar5 = uVar6 % 3 + 5;
    iVar13 = 0;
    do {
      pmVar9 = makemon(pm,level,(int)u.ux,(int)u.uy,1);
      iVar7 = iVar13;
      if ((pmVar9 == (monst *)0x0) || (iVar7 = 1, (mvitals[iVar4].mvflags & 1) != 0)) break;
      iVar13 = iVar13 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
    if (iVar7 != 0) {
      pcVar12 = makeplural(local_138);
      pline("Sent in some %s.",pcVar12);
      return;
    }
  }
  pcVar12 = "Nothing happens.";
LAB_0022f2b9:
  pline(pcVar12);
  return;
}

Assistant:

void do_genocide(int how, boolean only_on_level)
{
	char buf[BUFSZ];
	int	i, killplayer = 0;
	int mndx;
	const struct permonst *ptr;
	const char *which;

	if (how & PLAYER) {
		mndx = u.umonster;	/* non-polymorphed mon num */
		ptr = &mons[mndx];
		strcpy(buf, mons_mname(ptr));
		killplayer++;
	} else {
	    for (i = 0; ; i++) {
		if (i >= 5) {
		    pline("That's enough tries!");
		    return;
		}
		getlin("What monster do you want to genocide? [type the name]",
			buf);
		mungspaces(buf);
		/* choosing "none" preserves genocideless conduct */
		if (!strcmpi(buf, "none") || !strcmpi(buf, "nothing")) {
		    /* ... but no free pass if cursed */
		    if (!(how & REALLY)) {
			ptr = rndmonst(level);
			if (!ptr) return; /* no message, like normal case */
			mndx = monsndx(ptr);
			break;		/* remaining checks don't apply */
		    } else return;
		}

		if (wizard && buf[0] == '*') {
		    /* to aid in topology testing; remove pesky monsters */
		    struct monst *mtmp, *mtmp2;

		    int gonecnt = 0;
		    for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
			mtmp2 = mtmp->nmon;
			if (DEADMONSTER(mtmp)) continue;
			mongone(mtmp);
			gonecnt++;
		    }
		    pline("Eliminated %d monster%s.", gonecnt, plur(gonecnt));
		    return;
		}

		mndx = name_to_mon(buf);
		if (mndx == NON_PM || (mvitals[mndx].mvflags & G_GENOD)) {
			pline("Such creatures %s exist in this world.",
			      (mndx == NON_PM) ? "do not" : "no longer");
			continue;
		}
		ptr = &mons[mndx];
		/* Although "genus" is Latin for race, the hero benefits
		 * from both race and role; thus genocide affects either.
		 */
		if (Your_Own_Role(mndx) || Your_Own_Race(mndx)) {
			killplayer++;
			break;
		}
		if (is_human(ptr)) adjalign(-sgn(u.ualign.type));
		if (is_demon(ptr)) adjalign(sgn(u.ualign.type));

		if (!(ptr->geno & G_GENO)) {
			if (flags.soundok) {
	/* fixme: unconditional "caverns" will be silly in some circumstances */
			    if (flags.verbose)
			pline("A thunderous voice booms through the caverns:");
			    verbalize("No, mortal!  That will not be done.");
			}
			continue;
		}
		/* KMH -- Unchanging prevents rehumanization */
		if (Unchanging && ptr == youmonst.data)
		    killplayer++;
		break;
	    }
	}

	which = "all ";
	if (Hallucination) {
	    if (Upolyd)
		strcpy(buf, mons_mname(youmonst.data));
	    else {
		strcpy(buf, (flags.female && urole.name.f) ?
				urole.name.f : urole.name.m);
		buf[0] = lowc(buf[0]);
	    }
	} else {
	    strcpy(buf, mons_mname(ptr)); /* make sure we have standard singular */
	    if ((ptr->geno & G_UNIQ) && ptr != &mons[PM_HIGH_PRIEST])
		which = !type_is_pname(ptr) ? "the " : "";
	}
	if (how & REALLY) {
	    /* setting no-corpse affects wishing and random tin generation */
	    if (!only_on_level)
		mvitals[mndx].mvflags |= (G_GENOD | G_NOCORPSE);
	    pline("Wiped out %s%s%s.", which,
		  (*which != 'a') ? buf : makeplural(buf),
		  only_on_level ? " from this level" : "");
	    if (!only_on_level) {
		historic_event(FALSE, "genocided %s%s", which,
			       (*which != 'a') ? buf : makeplural(buf));
	    }

	    if (killplayer) {
		/* might need to wipe out dual role */
		if (!only_on_level) {
		    if (urole.femalenum != NON_PM && mndx == urole.malenum)
			mvitals[urole.femalenum].mvflags |= (G_GENOD | G_NOCORPSE);
		    if (urole.femalenum != NON_PM && mndx == urole.femalenum)
			mvitals[urole.malenum].mvflags |= (G_GENOD | G_NOCORPSE);
		    if (urace.femalenum != NON_PM && mndx == urace.malenum)
			mvitals[urace.femalenum].mvflags |= (G_GENOD | G_NOCORPSE);
		    if (urace.femalenum != NON_PM && mndx == urace.femalenum)
			mvitals[urace.malenum].mvflags |= (G_GENOD | G_NOCORPSE);
		}

		u.uhp = -1;
		if (how & PLAYER) {
		    killer_format = KILLED_BY;
		    killer = "genocidal confusion";
		} else if (how & ONTHRONE) {
		    /* player selected while on a throne */
		    killer_format = KILLED_BY_AN;
		    killer = "imperious order";
		} else { /* selected player deliberately, not confused */
		    killer_format = KILLED_BY_AN;
		    killer = "scroll of genocide";
		}

	/* Polymorphed characters will die as soon as they're rehumanized. */
	/* KMH -- Unchanging prevents rehumanization */
		if (Upolyd && ptr != youmonst.data) {
			delayed_killer = killer;
			killer = 0;
			pline("You feel dead inside.");
		} else
			done(GENOCIDED);
	    } else if (ptr == youmonst.data) {
		rehumanize();
	    }

	    if (only_on_level) {
		kill_monster_on_level(mndx);
	    } else {
		reset_rndmonst(mndx);
		kill_genocided_monsters();
		update_inventory();	/* in case identified eggs were affected */
	    }
	} else {
	    int cnt = 0;

	    if (!(mons[mndx].geno & G_UNIQ) &&
		    !(mvitals[mndx].mvflags & (G_GENOD | G_EXTINCT)))
		for (i = rn1(3, 4); i > 0; i--) {
		    if (!makemon(ptr, level, u.ux, u.uy, NO_MINVENT))
			break;	/* couldn't make one */
		    ++cnt;
		    if (mvitals[mndx].mvflags & G_EXTINCT)
			break;	/* just made last one */
		}
	    if (cnt)
		pline("Sent in some %s.", makeplural(buf));
	    else
		pline("Nothing happens.");
	}
}